

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notify_dispatch.c
# Opt level: O3

int dispatchEvent(void *arg,mpt_event *ev)

{
  uint uVar1;
  int iVar2;
  
  if (ev == (mpt_event *)0x0) {
    mpt_dispatch_fini((mpt_dispatch *)arg);
    free(arg);
    uVar1 = 0;
  }
  else {
    if (ev->id == 0) {
      if (ev->msg == (mpt_message *)0x0) {
        ev = (mpt_event *)0x0;
      }
      iVar2 = mpt_dispatch_emit((mpt_dispatch *)arg,ev);
      return iVar2;
    }
    if (ev->msg != (mpt_message *)0x0) {
      mpt_log((mpt_logger *)0x0,"mpt_dispatch_emit",3,"%s: 0xlx","unprocessed reply id");
    }
    uVar1 = (uint)(*(long *)((long)arg + 8) != 0);
  }
  return uVar1;
}

Assistant:

static int dispatchEvent(void *arg, MPT_STRUCT(event) *ev)
{
	MPT_STRUCT(dispatch) *disp = arg;
	if (!ev) {
		mpt_dispatch_fini(disp);
		free(disp);
		return 0;
	}
	/* process reply notification */
	if (ev->id) {
		if (ev->msg) {
			mpt_log(0, "mpt_dispatch_emit", MPT_LOG(Error), "%s: 0x" PRIxPTR,
			        MPT_tr("unprocessed reply id"), ev->id);
		}
		return disp->_def ? MPT_EVENTFLAG(Default) : 0;
	}
	/* trigger default event */
	if (!ev->msg) {
		ev = 0;
	}
	return mpt_dispatch_emit(disp, ev);
}